

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFactorySystem.cpp
# Opt level: O0

void __thiscall
ObjectFactorySystem::CompleteConstructorSwap
          (ObjectFactorySystem *this,ProtectedObjectSwapper *swapper)

{
  value_type pIVar1;
  bool bVar2;
  IObjectConstructor *pIVar3;
  reference ppIVar4;
  IObject *pIVar5;
  long *plVar6;
  reference ppIVar7;
  _Self local_78;
  iterator itEnd;
  iterator it;
  IObject *pObject_1;
  PerTypeObjectId objId_1;
  IObjectConstructor *pConstructor_1;
  size_t i_1;
  IObject *pObject;
  PerTypeObjectId objId;
  IObjectConstructor *pConstructor;
  size_t i;
  int a;
  int *p;
  ProtectedObjectSwapper *swapper_local;
  ObjectFactorySystem *this_local;
  
  bVar2 = RuntimeProtector::HasHadException(&swapper->super_RuntimeProtector);
  if ((bVar2) && (swapper->m_ProtectedPhase != PHASE_DELETEOLD)) {
    if (this->m_pLogger != (ICompilerLogger *)0x0) {
      (*(code *)**(undefined8 **)this->m_pLogger)
                (this->m_pLogger,
                 "Exception during object swapping, switching back to previous objects.\n");
      switch(swapper->m_ProtectedPhase) {
      case PHASE_NONE:
        break;
      case PHASE_SERIALIZEOUT:
        (*(code *)**(undefined8 **)this->m_pLogger)
                  (this->m_pLogger,"\tError occured during serialize out old objects phase.\n");
        break;
      case PHASE_CONSTRUCTNEW:
        (*(code *)**(undefined8 **)this->m_pLogger)
                  (this->m_pLogger,"\tError occured during constructing new objects phase.\n");
        break;
      case PHASE_SERIALIZEIN:
        (*(code *)**(undefined8 **)this->m_pLogger)
                  (this->m_pLogger,"\tError occured during serialize into the new objects phase.\n")
        ;
        break;
      case PHASE_AUTOCONSTRUCTSINGLETONS:
        (*(code *)**(undefined8 **)this->m_pLogger)
                  (this->m_pLogger,"\tError occured during auto construct singletons phase.\n");
        break;
      case PHASE_INITANDSERIALIZEOUTTEST:
        if ((this->m_bTestSerialization & 1U) == 0) {
          (*(code *)**(undefined8 **)this->m_pLogger)
                    (this->m_pLogger,"\tError occured during Initialization phase.\n");
        }
        else {
          (*(code *)**(undefined8 **)this->m_pLogger)
                    (this->m_pLogger,
                     "\tError occured during Initialization and serialize test of new objects phase.\n"
                    );
        }
        break;
      case PHASE_DELETEOLD:
      }
    }
    std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::operator=
              (&this->m_Constructors,&swapper->m_ConstructorsOld);
    if (swapper->m_ProtectedPhase != PHASE_SERIALIZEOUT) {
      SimpleSerializer::SetIsLoading(&swapper->m_Serializer,true);
      for (pConstructor = (IObjectConstructor *)0x0;
          pIVar3 = (IObjectConstructor *)
                   std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::size
                             (&this->m_Constructors), pConstructor < pIVar3;
          pConstructor = pConstructor + 1) {
        ppIVar4 = std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::
                  operator[](&this->m_Constructors,(size_type)pConstructor);
        pIVar1 = *ppIVar4;
        for (pObject = (IObject *)0x0; pIVar5 = (IObject *)(**(code **)(*(long *)pIVar1 + 0x60))(),
            pObject < pIVar5; pObject = pObject + 1) {
          pIVar5 = (IObject *)(**(code **)(*(long *)pIVar1 + 0x58))(pIVar1,pObject);
          if (pIVar5 != (IObject *)0x0) {
            SimpleSerializer::Serialize(&swapper->m_Serializer,pIVar5);
          }
        }
      }
      for (pConstructor_1 = (IObjectConstructor *)0x0;
          pIVar3 = (IObjectConstructor *)
                   std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::size
                             (&this->m_Constructors), pConstructor_1 < pIVar3;
          pConstructor_1 = pConstructor_1 + 1) {
        ppIVar4 = std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::
                  operator[](&this->m_Constructors,(size_type)pConstructor_1);
        pIVar1 = *ppIVar4;
        for (pObject_1 = (IObject *)0x0; pIVar5 = (IObject *)(**(code **)(*(long *)pIVar1 + 0x60))()
            , pObject_1 < pIVar5; pObject_1 = pObject_1 + 1) {
          plVar6 = (long *)(**(code **)(*(long *)pIVar1 + 0x58))(pIVar1,pObject_1);
          if (plVar6 != (long *)0x0) {
            (**(code **)(*plVar6 + 0x18))(plVar6,0);
          }
        }
      }
    }
  }
  else {
    if (this->m_pLogger != (ICompilerLogger *)0x0) {
      (**(code **)(*(long *)this->m_pLogger + 0x10))(this->m_pLogger,"Object swap completed\n");
    }
    bVar2 = RuntimeProtector::HasHadException(&swapper->super_RuntimeProtector);
    if (((bVar2) && (swapper->m_ProtectedPhase == PHASE_DELETEOLD)) &&
       (this->m_pLogger != (ICompilerLogger *)0x0)) {
      (*(code *)**(undefined8 **)this->m_pLogger)
                (this->m_pLogger,"Exception during object destruction of old objects, leaking.\n");
    }
  }
  itEnd = std::
          set<IObjectFactoryListener_*,_std::less<IObjectFactoryListener_*>,_std::allocator<IObjectFactoryListener_*>_>
          ::begin(&this->m_Listeners);
  local_78._M_node =
       (_Base_ptr)
       std::
       set<IObjectFactoryListener_*,_std::less<IObjectFactoryListener_*>,_std::allocator<IObjectFactoryListener_*>_>
       ::end(&this->m_Listeners);
  while (bVar2 = std::operator!=(&itEnd,&local_78), bVar2) {
    ppIVar7 = std::_Rb_tree_const_iterator<IObjectFactoryListener_*>::operator*(&itEnd);
    (*(code *)**(undefined8 **)*ppIVar7)();
    std::_Rb_tree_const_iterator<IObjectFactoryListener_*>::operator++(&itEnd);
  }
  return;
}

Assistant:

void ObjectFactorySystem::CompleteConstructorSwap( ProtectedObjectSwapper& swapper )
{
	if( swapper.HasHadException() && PHASE_DELETEOLD != swapper.m_ProtectedPhase )
	{
		if( m_pLogger )
		{
			m_pLogger->LogError( "Exception during object swapping, switching back to previous objects.\n" );
			switch( swapper.m_ProtectedPhase  )
			{
            case PHASE_NONE:
                AU_ASSERT( false );
                break;
			case PHASE_SERIALIZEOUT:
				m_pLogger->LogError( "\tError occured during serialize out old objects phase.\n" );
				break;
			case PHASE_CONSTRUCTNEW:
				m_pLogger->LogError( "\tError occured during constructing new objects phase.\n" );
				break;
			case PHASE_SERIALIZEIN:
				m_pLogger->LogError( "\tError occured during serialize into the new objects phase.\n" );
				break;
			case PHASE_AUTOCONSTRUCTSINGLETONS:
				m_pLogger->LogError( "\tError occured during auto construct singletons phase.\n" );
                break;
			case PHASE_INITANDSERIALIZEOUTTEST:
                if( m_bTestSerialization )
                {
				    m_pLogger->LogError( "\tError occured during Initialization and serialize test of new objects phase.\n" );
                }
                else
                {
				    m_pLogger->LogError( "\tError occured during Initialization phase.\n" );
                }
                break;
           case PHASE_DELETEOLD:
                break;
 			}
		}

		//swap back to new constructors before everything is serialized back in
		m_Constructors = swapper.m_ConstructorsOld;
		if( PHASE_SERIALIZEOUT != swapper.m_ProtectedPhase )
		{
			//serialize back with old objects - could cause exception which isn't handled, but hopefully not.
			swapper.m_Serializer.SetIsLoading( true );
			for( size_t i = 0; i < m_Constructors.size(); ++i )
			{
				IObjectConstructor* pConstructor = m_Constructors[i];
				for( PerTypeObjectId objId = 0; objId < pConstructor->GetNumberConstructedObjects(); ++ objId )
				{
					// Iserialize new object
					IObject* pObject = pConstructor->GetConstructedObject( objId );
					if (pObject)
					{
						swapper.m_Serializer.Serialize( pObject );
					}			
				}
			}

			// Do a second pass, initializing objects now that they've all been serialized
			for( size_t i = 0; i < m_Constructors.size(); ++i )
			{
				IObjectConstructor* pConstructor = m_Constructors[i];
				for( PerTypeObjectId objId = 0; objId < pConstructor->GetNumberConstructedObjects(); ++ objId )
				{
					IObject* pObject = pConstructor->GetConstructedObject( objId );
					if (pObject)
					{
						pObject->Init(false);
					}			
				}
			}
		}
	}
	else
	{
		if( m_pLogger ) m_pLogger->LogInfo( "Object swap completed\n");
		if( swapper.HasHadException() && PHASE_DELETEOLD == swapper.m_ProtectedPhase )
		{
			if( m_pLogger ) m_pLogger->LogError( "Exception during object destruction of old objects, leaking.\n" );
		}
	}

	// Notify any listeners that constructors have changed
	TObjectFactoryListeners::iterator it = m_Listeners.begin();
	TObjectFactoryListeners::iterator itEnd = m_Listeners.end();
	while (it != itEnd)
	{
		(*it)->OnConstructorsAdded();
		++it;
	}
}